

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
          (QPodArrayOps<QCheckPoint> *this,qsizetype i,QCheckPoint *args)

{
  QCheckPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QFixed QVar4;
  QFixed QVar5;
  int iVar6;
  QFixed QVar7;
  QFixed QVar8;
  QFixed QVar9;
  QCheckPoint *pQVar10;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QCheckPoint>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004f6a8d:
    QVar4.val = (args->y).val;
    QVar5.val = (args->frameY).val;
    iVar6 = args->positionInFrame;
    QVar7.val = (args->minimumWidth).val;
    QVar8.val = (args->maximumWidth).val;
    QVar9.val = (args->contentsWidth).val;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QCheckPoint>).size != 0);
    QArrayDataPointer<QCheckPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<QCheckPoint>,where,1,(QCheckPoint **)0x0,
               (QArrayDataPointer<QCheckPoint> *)0x0);
    pQVar10 = createHole(this,where,i,1);
    pQVar10->y = (QFixed)QVar4.val;
    pQVar10->frameY = (QFixed)QVar5.val;
    pQVar10->positionInFrame = iVar6;
    pQVar10->minimumWidth = (QFixed)QVar7.val;
    pQVar10->maximumWidth = (QFixed)QVar8.val;
    pQVar10->contentsWidth = (QFixed)QVar9.val;
  }
  else {
    if (((this->super_QArrayDataPointer<QCheckPoint>).size == i) &&
       (pQVar10 = (this->super_QArrayDataPointer<QCheckPoint>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar10 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      QVar4.val = (args->contentsWidth).val;
      pQVar10[i].maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar10[i].contentsWidth = (QFixed)QVar4.val;
      QVar4.val = (args->frameY).val;
      iVar6 = args->positionInFrame;
      QVar5.val = (args->minimumWidth).val;
      pQVar10 = pQVar10 + i;
      pQVar10->y = (QFixed)(args->y).val;
      pQVar10->frameY = (QFixed)QVar4.val;
      pQVar10->positionInFrame = iVar6;
      pQVar10->minimumWidth = (QFixed)QVar5.val;
    }
    else {
      if ((i != 0) ||
         (pQVar10 = (this->super_QArrayDataPointer<QCheckPoint>).ptr,
         (QCheckPoint *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar10)) goto LAB_004f6a8d;
      QVar4.val = (args->contentsWidth).val;
      pQVar10[-1].maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar10[-1].contentsWidth = (QFixed)QVar4.val;
      QVar4.val = (args->frameY).val;
      iVar6 = args->positionInFrame;
      QVar5.val = (args->minimumWidth).val;
      pQVar10[-1].y = (QFixed)(args->y).val;
      pQVar10[-1].frameY = (QFixed)QVar4.val;
      pQVar10[-1].positionInFrame = iVar6;
      pQVar10[-1].minimumWidth = (QFixed)QVar5.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QCheckPoint>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QCheckPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }